

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

char * __thiscall
despot::util::tinyxml::TiXmlElement::ReadValue
          (TiXmlElement *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  bool bVar1;
  int iVar2;
  TiXmlDocument *this_00;
  char *p_00;
  TiXmlText *this_01;
  TiXmlNode *node;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  while( true ) {
    p_00 = TiXmlBase::SkipWhiteSpace(p,encoding);
    if (p_00 == (char *)0x0) break;
    if (*p_00 == '<') {
      bVar1 = TiXmlBase::StringEqual(p_00,"</",false,encoding);
      if (bVar1) {
        return p_00;
      }
      node = TiXmlNode::Identify(&this->super_TiXmlNode,p_00,encoding);
      if (node == (TiXmlNode *)0x0) {
        return (char *)0x0;
      }
      iVar2 = (*(node->super_TiXmlBase)._vptr_TiXmlBase[3])(node,p_00,data);
      p = (char *)CONCAT44(extraout_var,iVar2);
      TiXmlNode::LinkEndChild(&this->super_TiXmlNode,node);
    }
    else {
      if (*p_00 == '\0') break;
      this_01 = (TiXmlText *)operator_new(0x58);
      TiXmlText::TiXmlText(this_01,"");
      if (TiXmlBase::condenseWhiteSpace == '\x01') {
        p = p_00;
      }
      iVar2 = (*(this_01->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[3])(this_01,p,data);
      p = (char *)CONCAT44(extraout_var_00,iVar2);
      bVar1 = TiXmlText::Blank(this_01);
      if (bVar1) {
        (*(this_01->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[1])(this_01);
      }
      else {
        TiXmlNode::LinkEndChild(&this->super_TiXmlNode,(TiXmlNode *)this_01);
      }
    }
  }
  if ((this_00 != (TiXmlDocument *)0x0) && (p_00 == (char *)0x0)) {
    TiXmlDocument::SetError(this_00,6,(char *)0x0,(TiXmlParsingData *)0x0,encoding);
  }
  return p_00;
}

Assistant:

const char* TiXmlElement::ReadValue(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	TiXmlDocument* document = GetDocument();

	// Read in text and elements in any order.
	const char* pWithWhiteSpace = p;
	p = SkipWhiteSpace(p, encoding);

	while (p && *p) {
		if (*p != '<') {
			// Take what we have, make a text element.
			TiXmlText* textNode = new TiXmlText("");

			if (!textNode) {
				if (document)
					document->SetError(TIXML_ERROR_OUT_OF_MEMORY, 0, 0,
						encoding);
				return 0;
			}

			if (TiXmlBase::IsWhiteSpaceCondensed()) {
				p = textNode->Parse(p, data, encoding);
			} else {
				// Special case: we want to keep the white space
				// so that leading spaces aren't removed.
				p = textNode->Parse(pWithWhiteSpace, data, encoding);
			}

			if (!textNode->Blank())
				LinkEndChild(textNode);
			else
				delete textNode;
		} else {
			// We hit a '<'
			// Have we hit a new element or an end tag? This could also be
			// a TiXmlText in the "CDATA" style.
			if (StringEqual(p, "</", false, encoding)) {
				return p;
			} else {
				TiXmlNode* node = Identify(p, encoding);
				if (node) {
					p = node->Parse(p, data, encoding);
					LinkEndChild(node);
				} else {
					return 0;
				}
			}
		}
		pWithWhiteSpace = p;
		p = SkipWhiteSpace(p, encoding);
	}

	if (!p) {
		if (document)
			document->SetError(TIXML_ERROR_READING_ELEMENT_VALUE, 0, 0,
				encoding);
	}
	return p;
}